

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NEST.cpp
# Opt level: O2

Wvalue NEST::NESTcalc::WorkFunction(double density,double MolarMass,bool OldW13eV)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  Wvalue WVar4;
  
  bVar1 = ValidityTests::nearlyEqual(54.0,18.0,1e-09);
  if (bVar1) {
    dVar3 = 0.21;
    dVar2 = 19.26782273603083;
  }
  else {
    dVar2 = (density / MolarMass) * 6.0221409e+23 * 54.0 * -1.01e-23 + 18.7263;
    if (OldW13eV) {
      dVar2 = dVar2 * 1.1716263232;
    }
    dVar3 = density * 0.039693 + 0.067366;
  }
  WVar4.alpha = dVar3;
  WVar4.Wq_eV = dVar2;
  return WVar4;
}

Assistant:

NESTcalc::Wvalue NESTcalc::WorkFunction(double density, double MolarMass,
                                        bool OldW13eV) {
  double alpha, Wq_eV;
  if (ValidityTests::nearlyEqual(ATOM_NUM, 18.)) {
    // Liquid argon
    alpha = 0.21;
    Wq_eV = 1000. / 51.9;  // 23.6/1.21; // ~19.2-5 eV
    return Wvalue{.Wq_eV = Wq_eV, .alpha = alpha};
  }
  alpha = 0.067366 + density * 0.039693;
  /*double xi_se = 9./(1.+pow(density/2.,2.));
  double I_ion = 9.+(12.13-9.)/(1.+pow(density/2.953,65.));
  double I_exc = I_ion / 1.46;
  double Wq_eV = I_exc*(alpha/(1.+alpha))+I_ion/(1.+alpha)
  +xi_se/(1.+alpha);*/
  double eDensity = (density / MolarMass) * NEST_AVO * ATOM_NUM;
  Wq_eV = 18.7263 - 1.01e-23 * eDensity;
  if (OldW13eV) Wq_eV *= ZurichEXOW;              // EXO
  return Wvalue{.Wq_eV = Wq_eV, .alpha = alpha};  // W and Nex/Ni together
}